

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

int re2::UnHex(int c)

{
  uint uVar1;
  ostream *this;
  LogMessage LStack_188;
  
  uVar1 = c - 0x30;
  if (9 < uVar1) {
    if (c - 0x41U < 6) {
      uVar1 = c - 0x37;
    }
    else if (c - 0x61U < 6) {
      uVar1 = c - 0x57;
    }
    else {
      LogMessage::LogMessage
                (&LStack_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
                 ,0x5a1);
      this = std::operator<<((ostream *)&LStack_188.str_,"Bad hex digit ");
      std::ostream::operator<<(this,c);
      LogMessage::~LogMessage(&LStack_188);
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

static int UnHex(int c) {
  if ('0' <= c && c <= '9')
    return c - '0';
  if ('A' <= c && c <= 'F')
    return c - 'A' + 10;
  if ('a' <= c && c <= 'f')
    return c - 'a' + 10;
  LOG(DFATAL) << "Bad hex digit " << c;
  return 0;
}